

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O1

void __thiscall TPZString::Append(TPZString *this,char *TailIncrement)

{
  ulong uVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  
  uVar1 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
          fNElements;
  if (uVar1 == 0) {
    lVar3 = 0;
  }
  else {
    sVar2 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
    lVar3 = (long)(int)sVar2;
  }
  sVar2 = strlen(TailIncrement);
  if (uVar1 < lVar3 + sVar2 + 1) {
    (*(this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>._vptr_TPZVec
      [3])(this);
  }
  strncpy((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore +
          lVar3,TailIncrement,
          (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
          fNElements - lVar3);
  __s = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore;
  if ((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements ==
      0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(__s);
  }
  __s[sVar2] = '\0';
  return;
}

Assistant:

void TPZString::Append(const char * TailIncrement)
{
	int OldLength = Length();
	size_t len = strlen(TailIncrement);
	
	if (fNElements < OldLength + len + 1) Resize(OldLength + len + 1); // the 1 stands for the null char
	
	strncpy(fStore + OldLength, TailIncrement,fNElements-OldLength);
	fStore[Length()] = '\0'; // just to ensure the string contains a null character
}